

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_fut.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  future<int> fut;
  int local_b4;
  ThreadPool t;
  
  ThreadPool::ThreadPool(&t,true);
  local_b4 = 10;
  ThreadPool::submit<int(&)(int,int),int,int>
            ((ThreadPool *)&fut,(_func_int_int_int *)&t,(int *)sum,&local_b4);
  iVar1 = std::future<int>::get(&fut);
  if (iVar1 == 0x20) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fut.super___basic_future<int>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    WorkItemScheduler::~WorkItemScheduler((WorkItemScheduler *)&t);
    return 0;
  }
  __assert_fail("fut.get() == sum(a, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Hellzy[P]cpp-threadpool/tests/basic_fut.cc"
                ,0x12,"int main()");
}

Assistant:

int main()
{

    ThreadPool t;
    int a = 10;
    int b = 22;

    auto fut = t.submit(sum, 10, 22);
    assert(fut.get() == sum(a, b));

    return 0;
}